

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdMan.c
# Opt level: O0

Dsd_Manager_t * Dsd_ManagerStart(DdManager *dd,int nSuppMax,int fVerbose)

{
  Dsd_Manager_t *__s;
  Dsd_Node_t **ppDVar1;
  st__table *psVar2;
  Dsd_Node_t *pDVar3;
  int local_2c;
  int i;
  Dsd_Node_t *pNode;
  Dsd_Manager_t *dMan;
  int fVerbose_local;
  int nSuppMax_local;
  DdManager *dd_local;
  
  if (nSuppMax <= dd->size) {
    __s = (Dsd_Manager_t *)malloc(0x40);
    memset(__s,0,0x40);
    __s->dd = dd;
    __s->nInputs = nSuppMax;
    __s->fVerbose = fVerbose;
    __s->nRoots = 0;
    __s->nRootsAlloc = 0x32;
    ppDVar1 = (Dsd_Node_t **)malloc((long)__s->nRootsAlloc << 3);
    __s->pRoots = ppDVar1;
    ppDVar1 = (Dsd_Node_t **)malloc((long)__s->nInputs << 3);
    __s->pInputs = ppDVar1;
    psVar2 = st__init_table(st__ptrcmp,st__ptrhash);
    __s->Table = psVar2;
    for (local_2c = 0; local_2c < __s->nInputs; local_2c = local_2c + 1) {
      pDVar3 = Dsd_TreeNodeCreate(2,1,0);
      pDVar3->G = dd->vars[local_2c];
      Cudd_Ref(pDVar3->G);
      pDVar3->S = dd->vars[local_2c];
      Cudd_Ref(pDVar3->S);
      st__insert(__s->Table,(char *)dd->vars[local_2c],(char *)pDVar3);
      __s->pInputs[local_2c] = pDVar3;
    }
    pDVar3 = Dsd_TreeNodeCreate(1,0,0);
    pDVar3->G = dd->one;
    Cudd_Ref(pDVar3->G);
    pDVar3->S = dd->one;
    Cudd_Ref(pDVar3->S);
    st__insert(__s->Table,(char *)dd->one,(char *)pDVar3);
    __s->pConst1 = pDVar3;
    Dsd_CheckCacheAllocate(5000);
    return __s;
  }
  __assert_fail("nSuppMax <= dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/dsd/dsdMan.c"
                ,0x35,"Dsd_Manager_t *Dsd_ManagerStart(DdManager *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                    FUNCTION DECLARATIONS                         ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                       API OF DSD MANAGER                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the DSD manager.]

  Description [Takes the started BDD manager and the maximum support size
  of the function to be DSD-decomposed. The manager should have at least as
  many variables as there are variables in the support. The functions should 
  be expressed using the first nSuppSizeMax variables in the manager (these
  may be ordered not necessarily on top of the manager).]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Dsd_Manager_t * Dsd_ManagerStart( DdManager * dd, int nSuppMax, int fVerbose )
{
    Dsd_Manager_t * dMan;
    Dsd_Node_t * pNode;
    int i;

    assert( nSuppMax <= dd->size );

    dMan = ABC_ALLOC( Dsd_Manager_t, 1 );
    memset( dMan, 0, sizeof(Dsd_Manager_t) );
    dMan->dd          = dd;
    dMan->nInputs     = nSuppMax;
    dMan->fVerbose    = fVerbose;
    dMan->nRoots      = 0;
    dMan->nRootsAlloc = 50;
    dMan->pRoots      = (Dsd_Node_t **) ABC_ALLOC( char, dMan->nRootsAlloc * sizeof(Dsd_Node_t *) );
    dMan->pInputs     = (Dsd_Node_t **) ABC_ALLOC( char, dMan->nInputs     * sizeof(Dsd_Node_t *) );

    // create the primary inputs and insert them into the table
    dMan->Table       = st__init_table( st__ptrcmp, st__ptrhash);
    for ( i = 0; i < dMan->nInputs; i++ )
    {
        pNode = Dsd_TreeNodeCreate( DSD_NODE_BUF, 1, 0 );
        pNode->G = dd->vars[i];  Cudd_Ref( pNode->G );
        pNode->S = dd->vars[i];  Cudd_Ref( pNode->S );
        st__insert( dMan->Table, (char*)dd->vars[i], (char*)pNode );
        dMan->pInputs[i] = pNode;
    }
    pNode = Dsd_TreeNodeCreate( DSD_NODE_CONST1, 0, 0 );
    pNode->G = b1;  Cudd_Ref( pNode->G );
    pNode->S = b1;  Cudd_Ref( pNode->S );
    st__insert( dMan->Table, (char*)b1, (char*)pNode );
    dMan->pConst1 = pNode;

    Dsd_CheckCacheAllocate( 5000 );
    return dMan;
}